

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server_func(client_socket *client)

{
  int fd;
  ssize_t sVar1;
  size_t sVar2;
  string ret;
  char buf [8192];
  string local_2078;
  string local_2058;
  char local_2038 [8200];
  
  fd = client->sockfd;
  sVar1 = C_std::Read(fd,local_2038,0x2000);
  if (0 < (int)sVar1) {
    do {
      local_2038[(uint)sVar1 & 0x7fffffff] = '\0';
      local_2058._M_dataplus._M_p = (pointer)&local_2058.field_2;
      sVar2 = strlen(local_2038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2058,local_2038,local_2038 + sVar2);
      algorithm(&local_2078,&local_2058);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2058._M_dataplus._M_p != &local_2058.field_2) {
        operator_delete(local_2058._M_dataplus._M_p,local_2058.field_2._M_allocated_capacity + 1);
      }
      C_std::Write(fd,local_2078._M_dataplus._M_p,local_2078._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2078._M_dataplus._M_p != &local_2078.field_2) {
        operator_delete(local_2078._M_dataplus._M_p,local_2078.field_2._M_allocated_capacity + 1);
      }
      sVar1 = C_std::Read(fd,local_2038,0x2000);
    } while (0 < (int)sVar1);
  }
  C_std::Close(fd);
  return;
}

Assistant:

void server_func(const C_std::Network::client_socket &client) {
    int client_sockfd = client.sockfd;
    char buf[BUFSIZ];
    int n;
    while ((n = Read(client_sockfd, buf, BUFSIZ)) > 0) {
        //客户端没有关闭，服务端阻塞等待客户端输入
//        int fd = Open("./test.log", O_CREAT | O_RDWR | O_APPEND, 0644);
//        Write(fd, "read:", 5);
//        Write(fd, buf, n);
        buf[n] = '\0';
        string ret = algorithm(buf);
//        Write(fd, "write:", 6);
//        Write(fd, ret.c_str(), ret.size());
//        close(fd);
        Write(client_sockfd, ret.c_str(), ret.size());
    }
    //关闭客户端socket写端
    Close(client_sockfd);
}